

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::ServiceDescriptorProto::IsInitialized(ServiceDescriptorProto *this)

{
  int iVar1;
  Type *pTVar2;
  int i;
  int iVar3;
  ServiceOptions *pSVar4;
  
  iVar3 = 0;
  while (iVar3 < (this->method_).super_RepeatedPtrFieldBase.current_size_) {
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                       (&(this->method_).super_RepeatedPtrFieldBase,iVar3);
    iVar1 = (*(pTVar2->super_Message).super_MessageLite._vptr_MessageLite[5])(pTVar2);
    iVar3 = iVar3 + 1;
    if ((char)iVar1 == '\0') {
      return false;
    }
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    pSVar4 = this->options_;
    if (pSVar4 == (ServiceOptions *)0x0) {
      pSVar4 = *(ServiceOptions **)(default_instance_ + 0x30);
    }
    iVar3 = (*(pSVar4->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((char)iVar3 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool ServiceDescriptorProto::IsInitialized() const {

  for (int i = 0; i < method_size(); i++) {
    if (!this->method(i).IsInitialized()) return false;
  }
  if (has_options()) {
    if (!this->options().IsInitialized()) return false;
  }
  return true;
}